

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_union_table
               (flatcc_json_printer_t *ctx,flatcc_json_printer_union_descriptor_t *ud,
               flatcc_json_printer_table_f *pf)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  char *__s;
  ulong __n;
  char *pcVar4;
  size_t __n_00;
  flatcc_json_printer_table_descriptor_t local_38;
  
  local_38.ttl = ud->ttl + -1;
  if (local_38.ttl == 0) {
    if (ctx->error == 0) {
      ctx->error = 2;
    }
  }
  else {
    puVar2 = (uint *)ud->member;
    uVar1 = *puVar2;
    local_38.table = (void *)((long)puVar2 + (ulong)uVar1);
    ctx->level = ctx->level + 1;
    pcVar4 = ctx->p;
    ctx->p = pcVar4 + 1;
    *pcVar4 = '{';
    local_38.count = 0;
    local_38.vtable = (void *)((long)local_38.table - (long)*(int *)((long)puVar2 + (ulong)uVar1));
    local_38.vsize = (int)*local_38.vtable;
    (*pf)(ctx,&local_38);
    pcVar4 = ctx->p;
    if (ctx->indent != '\0') {
      ctx->p = pcVar4 + 1;
      *pcVar4 = '\n';
      lVar3 = (long)ctx->level + -1;
      ctx->level = (int)lVar3;
      __n = (ulong)ctx->indent * lVar3;
      pcVar4 = ctx->pflush;
      __s = ctx->p;
      if (pcVar4 < __s + __n) {
        if (pcVar4 <= __s) {
          (*ctx->flush)(ctx,0);
          pcVar4 = ctx->pflush;
          __s = ctx->p;
        }
        __n_00 = (long)pcVar4 - (long)__s;
        if (__n_00 < __n) {
          do {
            memset(__s,0x20,__n_00);
            ctx->p = ctx->p + __n_00;
            __n = __n - __n_00;
            (*ctx->flush)(ctx,0);
            __s = ctx->p;
            __n_00 = (long)ctx->pflush - (long)__s;
          } while (__n_00 < __n);
        }
      }
      memset(__s,0x20,__n);
      pcVar4 = ctx->p + __n;
    }
    ctx->p = pcVar4 + 1;
    *pcVar4 = '}';
  }
  return;
}

Assistant:

void flatcc_json_printer_union_table(flatcc_json_printer_t *ctx,
        flatcc_json_printer_union_descriptor_t *ud,
        flatcc_json_printer_table_f pf)
{
    print_table_object(ctx, read_uoffset_ptr(ud->member), ud->ttl, pf);
}